

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void resume(lua_State *L,void *ud)

{
  CallInfo *ci;
  lua_KFunction p_Var1;
  int iVar2;
  StkId firstResult;
  
  iVar2 = *ud;
  firstResult = L->top + -(long)iVar2;
  if (L->status != '\0') {
    ci = L->ci;
    L->status = '\0';
    ci->func = (StkId)((long)&L->stack->value_ + ci->extra);
    if ((ci->callstatus & 2) == 0) {
      p_Var1 = (ci->u).c.k;
      if (p_Var1 != (lua_KFunction)0x0) {
        iVar2 = (*p_Var1)(L,1,(ci->u).c.ctx);
        firstResult = L->top + -(long)iVar2;
      }
      luaD_poscall(L,ci,firstResult,iVar2);
    }
    else {
      luaV_execute(L);
    }
    unroll(L,(void *)0x0);
    return;
  }
  iVar2 = luaD_precall(L,firstResult + -1,-1);
  if (iVar2 != 0) {
    return;
  }
  luaV_execute(L);
  return;
}

Assistant:

static void resume(lua_State *L, void *ud) {
    int n = *(cast(int*, ud));  /* number of arguments */
    StkId firstArg = L->top - n;  /* first argument */
    CallInfo *ci = L->ci;
    if (L->status == LUA_OK) {  /* starting a coroutine? */
        if (!luaD_precall(L, firstArg - 1, LUA_MULTRET))  /* Lua function? */
            luaV_execute(L);  /* call it */
    } else {  /* resuming from previous yield */
        lua_assert(L->status == LUA_YIELD);
        L->status = LUA_OK;  /* mark that it is running (again) */
        ci->func = restorestack(L, ci->extra);
        if (isLua(ci))  /* yielded inside a hook? */
            luaV_execute(L);  /* just continue running Lua code */
        else {  /* 'common' yield */
            if (ci->u.c.k != NULL) {  /* does it have a continuation function? */
                lua_unlock(L);
                n = (*ci->u.c.k)(L, LUA_YIELD, ci->u.c.ctx); /* call continuation */
                lua_lock(L);
                api_checknelems(L, n);
                firstArg = L->top - n;  /* yield results come from continuation */
            }
            luaD_poscall(L, ci, firstArg, n);  /* finish 'luaD_precall' */
        }
        unroll(L, NULL);  /* run continuation */
    }
}